

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

Promise<kj::AuthenticatedStream> __thiscall
kj::TlsConnectionReceiver::acceptAuthenticated(TlsConnectionReceiver *this)

{
  long in_RSI;
  Exception local_1b8;
  Exception *local_28;
  Exception *e;
  Exception *_e546;
  TlsConnectionReceiver *this_local;
  
  this_local = this;
  local_28 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(in_RSI + 0xb0));
  e = local_28;
  if (local_28 == (Exception *)0x0) {
    ProducerConsumerQueue<kj::AuthenticatedStream>::pop
              ((ProducerConsumerQueue<kj::AuthenticatedStream> *)this);
  }
  else {
    Exception::Exception(&local_1b8,local_28);
    Promise<kj::AuthenticatedStream>::Promise((Promise<kj::AuthenticatedStream> *)this,&local_1b8);
    Exception::~Exception(&local_1b8);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> acceptAuthenticated() override {
    KJ_IF_SOME(e, maybeInnerException) {
      // We've experienced an exception from the inner receiver, we consider this unrecoverable.
      return Exception(e);
    }

    return queue.pop();
  }